

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr
deqp::TestSubcase::
Create<glcts::(anonymous_namespace)::CModeDrawElementsTriangleStripAdjacency<glcts::(anonymous_namespace)::test_api::GL>>
          (void)

{
  CPrimitiveMode *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (CPrimitiveMode *)operator_new(0x58);
  glcts::anon_unknown_0::CPrimitiveMode::CPrimitiveMode(this,DRAW_ELEMENTS,0xd,4,4);
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01de7be8;
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}